

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdiChroma_XY(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int xoffsets [64];
  int aiStack_238 [64];
  int aiStack_138 [50];
  int imult;
  
  if (0 < iWidth) {
    iVar8 = (int)tab_auc_dir_dxdy[1][uiDirMode][0];
    bVar1 = tab_auc_dir_dxdy[1][uiDirMode][1];
    uVar12 = 0;
    iVar13 = iVar8;
    iVar7 = iVar8 * 0x20;
    do {
      iVar6 = iVar13 >> (bVar1 & 0x1f);
      aiStack_238[uVar12] = iVar6;
      aiStack_138[uVar12] = (iVar7 >> (bVar1 & 0x1f)) + iVar6 * -0x20;
      uVar12 = uVar12 + 1;
      iVar7 = iVar7 + iVar8 * 0x20;
      iVar13 = iVar13 + iVar8;
    } while ((uint)iWidth != uVar12);
  }
  if (0 < iHeight) {
    cVar2 = tab_auc_dir_dxdy[0][uiDirMode][0];
    bVar1 = tab_auc_dir_dxdy[0][uiDirMode][1];
    iVar13 = 0;
    do {
      iVar7 = iVar13 + 1;
      iVar6 = iVar7 * cVar2;
      iVar8 = iVar6 >> (bVar1 & 0x1f);
      if (0 < iWidth) {
        iVar6 = (iVar6 * 0x20 >> (bVar1 & 0x1f)) + iVar8 * -0x20;
        lVar4 = 0;
        lVar10 = 0;
        do {
          lVar11 = (long)iVar13 - (long)*(int *)((long)aiStack_238 + lVar10 * 2);
          iVar5 = (int)lVar11;
          uVar12 = lVar4 >> 0x20;
          if (iVar5 < 0) {
            dst[uVar12] = (pel)((uint)pSrc[lVar10 - iVar8 * 2] * (iVar6 + 0x20) +
                                (uint)pSrc[lVar10 + (2 - (long)(iVar8 * 2))] * (0x40 - iVar6) +
                                (uint)pSrc[lVar10 + (4 - (long)(iVar8 * 2))] * (0x20 - iVar6) +
                                (uint)pSrc[lVar10 + (-2 - (long)(iVar8 * 2))] * iVar6 + 0x40 >> 7);
            iVar5 = (uint)pSrc[lVar10 + (1 - (long)(iVar8 * 2))] * (iVar6 + 0x20) +
                    (uint)pSrc[lVar10 + (3 - (long)(iVar8 * 2))] * (0x40 - iVar6) +
                    (uint)pSrc[lVar10 + (5 - (long)(iVar8 * 2))] * (0x20 - iVar6) +
                    (uint)pSrc[lVar10 + (-1 - (long)(iVar8 * 2))] * iVar6;
            uVar12 = (ulong)((int)lVar10 + 1);
          }
          else {
            iVar3 = *(int *)((long)aiStack_138 + lVar10 * 2);
            pbVar9 = pSrc + lVar11 * -2;
            dst[uVar12] = (pel)((uint)pbVar9[2] * iVar3 +
                                (uint)*pbVar9 * (iVar3 + 0x20) +
                                (uint)pbVar9[-2] * (0x40 - iVar3) +
                                (uint)pbVar9[-4] * (0x20 - iVar3) + 0x40 >> 7);
            iVar5 = (uint)pbVar9[3] * iVar3 +
                    (uint)pSrc[(long)(iVar5 * -2) + 1] * (iVar3 + 0x20) +
                    (uint)pbVar9[-1] * (0x40 - iVar3) + (uint)pbVar9[-3] * (0x20 - iVar3);
            uVar12 = uVar12 | 1;
          }
          dst[uVar12] = (pel)(iVar5 + 0x40U >> 7);
          lVar10 = lVar10 + 2;
          lVar4 = lVar4 + 0x200000000;
        } while ((ulong)(uint)iWidth * 2 != lVar10);
      }
      dst = dst + i_dst;
      iVar13 = iVar7;
    } while (iVar7 != iHeight);
  }
  return;
}

Assistant:

static void xPredIntraAngAdiChroma_XY(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i, j;
    int offsetx, offsety;
    pel *rpSrc = pSrc;
    int xoffsets[64];
    int xsteps[64];

    for (i = 0; i < iWidth; i++) {
        xsteps[i] = getContextPixel(uiDirMode, 1, i + 1, &xoffsets[i]);
    }

    for (j = 0; j < iHeight; j++) {
        int srcOff = getContextPixel(uiDirMode, 0, j + 1, &offsetx) << 1;
        pel *px = pSrc - srcOff;

        for (i = 0; i < iWidth; i++, px += 2) {
            int iYy = j - xsteps[i];
            int i2 = i << 1;
            if (iYy <= -1) {
                dst[i2] = (px[4] * (32 - offsetx) + px[2] * (64 - offsetx) + px[0] * (32 + offsetx) + px[-2] * offsetx + 64) >> 7; //U
                dst[i2 + 1] = (px[5] * (32 - offsetx) + px[3] * (64 - offsetx) + px[1] * (32 + offsetx) + px[-1] * offsetx + 64) >> 7; //V
            }
            else {
                offsety = xoffsets[i];
                iYy *= 2;
                dst[i2] = (rpSrc[-iYy - 4] * (32 - offsety) + rpSrc[-iYy - 2] * (64 - offsety) + rpSrc[-iYy] * (32 + offsety) + rpSrc[-iYy + 2] * offsety + 64) >> 7; //U
                dst[i2 + 1] = (rpSrc[-iYy - 3] * (32 - offsety) + rpSrc[-iYy - 1] * (64 - offsety) + rpSrc[-iYy + 1] * (32 + offsety) + rpSrc[-iYy + 3] * offsety + 64) >> 7; //U
            }
        }
        dst += i_dst;
    }
}